

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O1

int32_t zng_gzdirect(gzFile file)

{
  if (file != (gzFile)0x0) {
    if (((file[1].have == 0x1c4f) && (*(int *)((long)&file[2].pos + 4) == 0)) && (file->have == 0))
    {
      gz_look((gz_state *)file);
    }
    return (int32_t)file[2].pos;
  }
  return 0;
}

Assistant:

int Z_EXPORT PREFIX(gzdirect)(gzFile file) {
    gz_state *state;

    /* get internal structure */
    if (file == NULL)
        return 0;

    state = (gz_state *)file;

    /* if the state is not known, but we can find out, then do so (this is
       mainly for right after a gzopen() or gzdopen()) */
    if (state->mode == GZ_READ && state->how == LOOK && state->x.have == 0)
        (void)gz_look(state);

    /* return 1 if transparent, 0 if processing a gzip stream */
    return state->direct;
}